

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++:89:30)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_mutex_test_c__:89:30)>
             *this)

{
  MutexGuarded<unsigned_int> *pMVar1;
  MonotonicClock *pMVar2;
  long lVar3;
  DebugComparison<kj::Maybe<kj::Locked<unsigned_int>_>_&,_const_kj::None_&> _kjCondition;
  Maybe<kj::Locked<unsigned_int>_> maybeLock;
  Quantity<long,_kj::_::NanosecondLabel> duration;
  Quantity<long,_kj::_::NanosecondLabel> timeout;
  DebugComparison<kj::Maybe<kj::Locked<unsigned_int>_>_&,_const_kj::None_&> local_68;
  undefined1 local_40 [16];
  uint *local_30;
  Quantity<long,_kj::_::NanosecondLabel> local_28;
  undefined8 local_20;
  
  local_20 = 8000000;
  pMVar1 = (this->f).value;
  local_68.left = (Maybe<kj::Locked<unsigned_int>_> *)CONCAT71(local_68.left._1_7_,1);
  local_68.right = (None *)0x7a1200;
  local_40[0] = _::Mutex::lock(&pMVar1->mutex,0);
  if ((bool)local_40[0]) {
    local_30 = &pMVar1->value;
    local_40._8_8_ = pMVar1;
  }
  pMVar2 = systemPreciseMonotonicClock();
  lVar3 = (*(code *)**(undefined8 **)pMVar2)(pMVar2);
  local_28.value = lVar3 - (((this->f).threadStartTime)->value).value;
  local_68.left = (Maybe<kj::Locked<unsigned_int>_> *)local_40;
  local_68.result = (bool)(local_40[0] ^ 1);
  local_68.right = (None *)&none;
  local_68.op.content.ptr = " == ";
  local_68.op.content.size_ = 5;
  if ((local_40[0] & _::Debug::minSeverity < 3) != 0) {
    _::Debug::
    log<char_const(&)[39],kj::_::DebugComparison<kj::Maybe<kj::Locked<unsigned_int>>&,kj::None_const&>&,kj::Quantity<long,kj::_::NanosecondLabel>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x5e,ERROR,"\"failed: expected \" \"maybeLock == kj::none\", _kjCondition, duration"
               ,(char (*) [39])"failed: expected maybeLock == kj::none",&local_68,&local_28);
  }
  local_68.result = 7999999 < local_28.value;
  local_68.right = (None *)&local_20;
  local_68.op.content.ptr = " >= ";
  local_68.op.content.size_ = 5;
  local_68.left = (Maybe<kj::Locked<unsigned_int>_> *)&local_28;
  if ((local_28.value < 8000000) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[37],kj::_::DebugComparison<kj::Quantity<long,kj::_::NanosecondLabel>&,kj::Quantity<long,kj::_::NanosecondLabel>&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0x5f,ERROR,"\"failed: expected \" \"duration >= timeout\", _kjCondition",
               (char (*) [37])"failed: expected duration >= timeout",
               (DebugComparison<kj::Quantity<long,_kj::_::NanosecondLabel>_&,_kj::Quantity<long,_kj::_::NanosecondLabel>_&>
                *)&local_68);
  }
  if ((local_40[0] == 1) &&
     ((MutexGuarded<unsigned_int> *)local_40._8_8_ != (MutexGuarded<unsigned_int> *)0x0)) {
    _::Mutex::unlock((Mutex *)local_40._8_8_,EXCLUSIVE,(Waiter *)0x0);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }